

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O0

void plutovg_canvas_glyph_metrics
               (plutovg_canvas_t *canvas,plutovg_codepoint_t codepoint,float *advance_width,
               float *left_side_bearing,plutovg_rect_t *extents)

{
  plutovg_state_t *ppVar1;
  plutovg_state_t *state;
  plutovg_rect_t *extents_local;
  float *left_side_bearing_local;
  float *advance_width_local;
  plutovg_codepoint_t codepoint_local;
  plutovg_canvas_t *canvas_local;
  
  ppVar1 = canvas->state;
  if ((ppVar1->font_face == (plutovg_font_face_t *)0x0) || (ppVar1->font_size <= 0.0)) {
    if (advance_width != (float *)0x0) {
      *advance_width = 0.0;
    }
    if (left_side_bearing != (float *)0x0) {
      *left_side_bearing = 0.0;
    }
    if (extents != (plutovg_rect_t *)0x0) {
      extents->x = 0.0;
      extents->y = 0.0;
      extents->w = 0.0;
      extents->h = 0.0;
    }
  }
  else {
    plutovg_font_face_get_glyph_metrics
              (ppVar1->font_face,ppVar1->font_size,codepoint,advance_width,left_side_bearing,extents
              );
  }
  return;
}

Assistant:

void plutovg_canvas_glyph_metrics(plutovg_canvas_t* canvas, plutovg_codepoint_t codepoint, float* advance_width, float* left_side_bearing, plutovg_rect_t* extents)
{
    plutovg_state_t* state = canvas->state;
    if(state->font_face && state->font_size > 0.f) {
        plutovg_font_face_get_glyph_metrics(state->font_face, state->font_size, codepoint, advance_width, left_side_bearing, extents);
        return;
    }

    if(advance_width) *advance_width = 0.f;
    if(left_side_bearing) *left_side_bearing = 0.f;
    if(extents) {
        extents->x = 0.f;
        extents->y = 0.f;
        extents->w = 0.f;
        extents->h = 0.f;
    }
}